

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::LoadNativeCodeData(IRBuilder *this)

{
  Func *this_00;
  bool bVar1;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  StackSym *opnd;
  Instr *instr;
  RegOpnd *nativeDataOpnd;
  IRBuilder *this_local;
  
  bVar1 = Func::IsOOPJIT(this->m_func);
  if ((bVar1) && (bVar1 = Func::IsTopFunc(this->m_func), bVar1)) {
    dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
    instr_00 = IR::Instr::New(LdNativeCodeData,&dstOpnd->super_Opnd,this->m_func);
    AddInstr(this,instr_00,0xffffffff);
    this_00 = this->m_func;
    opnd = IR::Opnd::GetStackSym(&dstOpnd->super_Opnd);
    Func::SetNativeCodeDataSym(this_00,opnd);
  }
  return;
}

Assistant:

void
IRBuilder::LoadNativeCodeData()
{
    if (m_func->IsOOPJIT() && m_func->IsTopFunc())
    {
        IR::RegOpnd * nativeDataOpnd = IR::RegOpnd::New(TyVar, m_func);
        IR::Instr * instr = IR::Instr::New(Js::OpCode::LdNativeCodeData, nativeDataOpnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        m_func->SetNativeCodeDataSym(nativeDataOpnd->GetStackSym());
    }
}